

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

float FACT_INTERNAL_CalculateFilterFrequency(float desiredFrequency,uint32_t sampleRate)

{
  uint in_EDI;
  float in_XMM0_Da;
  double dVar1;
  float freq;
  undefined4 local_14;
  undefined4 local_10;
  
  if (0.5 <= in_XMM0_Da / (float)in_EDI) {
    local_10 = 0.5;
  }
  else {
    local_10 = in_XMM0_Da / (float)in_EDI;
  }
  dVar1 = (double)SDL_sin((double)(local_10 * 3.1415927));
  local_14 = (float)(dVar1 * 2.0);
  if (1.0 <= local_14) {
    local_14 = 1.0;
  }
  return local_14;
}

Assistant:

static inline float FACT_INTERNAL_CalculateFilterFrequency(
	float desiredFrequency,
	uint32_t sampleRate
) {
	/* This is needed to convert linear frequencies to the value
	 * FAudio_INTERNAL_FilterVoice expects, in order for it to actually
	 * filter at the correct frequency.
	 *
	 * The formula is...
	 *
	 * (2 * sin(pi * (desired filter cutoff frequency) / sampleRate))
	 *
	 * ... but it behaves badly as the filter frequency gets too high as a
	 * fraction of the sample rate, hence the mins.
	 *
	 * -@Woflox
	 */
	float freq = 2 * FAudio_sin(
		F3DAUDIO_PI *
		FAudio_min(desiredFrequency / sampleRate, 0.5f)
	);
	return FAudio_min(freq, 1.0f);
}